

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::reserve
          (vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this,uint new_capacity)

{
  uint uVar1;
  uint uVar2;
  vq_node *pvVar3;
  void *p;
  long lVar4;
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> tmp;
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> local_28;
  
  if (this->m_capacity < new_capacity) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,new_capacity,false,0x70,object_mover,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_28.m_p = (vq_node *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,new_capacity,false,0x70,object_mover,false);
    operator=(&local_28,this);
    pvVar3 = this->m_p;
    this->m_p = local_28.m_p;
    uVar1 = this->m_size;
    this->m_size = local_28.m_size;
    uVar2 = this->m_capacity;
    this->m_capacity = local_28.m_capacity;
    local_28.m_capacity = uVar2;
    local_28.m_size = uVar1;
    if (pvVar3 != (vq_node *)0x0) {
      local_28.m_p = pvVar3;
      if ((ulong)uVar1 != 0) {
        lVar4 = 0;
        do {
          p = *(void **)((long)(&pvVar3->m_centroid + 1) + lVar4 + 0x10);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar4 = lVar4 + 0x70;
        } while ((ulong)uVar1 * 0x70 - lVar4 != 0);
      }
      crnlib_free(local_28.m_p);
    }
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            if (new_capacity > m_capacity)
            {
                increase_capacity(new_capacity, false);
            }
            else if (new_capacity < m_capacity)
            {
                // Must work around the lack of a "decrease_capacity()" method.
                // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
                vector tmp;
                tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
                tmp = *this;
                swap(tmp);
            }
        }